

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_std_gain_t<long_double,float>
                 (float *x,float xmean,size_t *ix_arr,size_t st,size_t end,double *sd_arr,
                 GainCriterion criterion,double min_gain,double *split_point,size_t *split_ix)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  undefined4 in_register_0000008c;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  float fVar12;
  double dVar13;
  longdouble local_98;
  
  calc_sd_right_to_left<long_double,float>
            ((longdouble *)x,(float *)ix_arr,xmean,(size_t *)st,end,(size_t)sd_arr,
             (double *)CONCAT44(in_register_0000008c,criterion));
  lVar2 = (end - st) + 1;
  fVar12 = x[ix_arr[st]];
  lVar6 = (longdouble)lVar2 + (longdouble)(float)(&DAT_0036e0d8)[lVar2 < 0];
  *split_ix = st;
  local_98 = (longdouble)-INFINITY;
  lVar2 = end - st;
  if (st <= end && lVar2 != 0) {
    local_98 = (longdouble)-INFINITY;
    lVar10 = (longdouble)0;
    lVar3 = 0;
    sVar5 = st;
    lVar11 = lVar10;
    lVar9 = (longdouble)(fVar12 - xmean);
    do {
      lVar7 = (longdouble)(fVar12 - xmean);
      lVar4 = lVar3 + 1;
      lVar8 = (longdouble)lVar4 + (longdouble)(float)(&DAT_0036e0d8)[lVar4 < 0];
      lVar10 = lVar10 + (lVar7 - lVar10) / lVar8;
      lVar11 = (lVar7 - lVar10) * (lVar7 - lVar9) + lVar11;
      fVar1 = x[ix_arr[st + lVar3 + 1]];
      if ((fVar12 != fVar1) || (NAN(fVar12) || NAN(fVar1))) {
        lVar9 = (longdouble)0;
        if (lVar3 != 0) {
          lVar9 = SQRT(lVar11 / lVar8);
        }
        if (criterion == Pooled) {
          lVar9 = (longdouble)1 +
                  (-(longdouble)1 / in_ST0) *
                  ((lVar8 / lVar6) * lVar9 +
                  (((longdouble)lVar2 + (longdouble)(float)(&DAT_0036e0d8)[lVar2 < 0]) / lVar6) *
                  (longdouble)sd_arr[lVar3 + 1]);
        }
        else {
          lVar9 = (longdouble)1 - (lVar9 + (longdouble)sd_arr[lVar3 + 1]) / (in_ST0 + in_ST0);
        }
        if ((longdouble)min_gain < lVar9 && local_98 < lVar9) {
          sVar5 = lVar3 + st;
          *split_ix = sVar5;
          local_98 = lVar9;
        }
      }
      lVar2 = lVar2 + -1;
      lVar3 = lVar4;
      lVar9 = lVar10;
      fVar12 = fVar1;
    } while (lVar2 != 0);
    if (local_98 != (longdouble)-INFINITY) {
      dVar13 = midpoint<float>(x[ix_arr[sVar5]],x[ix_arr[sVar5 + 1]]);
      *split_point = dVar13;
    }
  }
  return (double)local_98;
}

Assistant:

double find_split_std_gain_t(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr,
                             GainCriterion criterion, double min_gain, double &restrict split_point, size_t &restrict split_ix)
{
    real_t full_sd = calc_sd_right_to_left<real_t>(x, xmean, ix_arr, st, end, sd_arr);
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[ix_arr[st]] - xmean;
    real_t best_gain = -HUGE_VAL;
    real_t n = (real_t)(end - st + 1);
    real_t this_sd, this_gain;
    split_ix = st;
    for (size_t row = st; row < end; row++)
    {
        running_mean   += ((x[ix_arr[row]] - xmean) - running_mean) / (real_t)(row-st+1);
        running_ssq    += ((x[ix_arr[row]] - xmean) - running_mean) * ((x[ix_arr[row]] - xmean) - mean_prev);
        mean_prev       =  running_mean;
        if (x[ix_arr[row]] == x[ix_arr[row+1]])
            continue;

        this_sd = (row == st)? 0. : std::sqrt(running_ssq / (real_t)(row-st+1));
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, n, this_sd, sd_arr[row-st+1], row-st+1, end-row)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row-st+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            split_ix = row;
        }
    }
    
    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);

    return best_gain;
}